

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::OverheadTest::OverheadTest
          (OverheadTest *this,size_t first,size_t max_block_size)

{
  upb_Arena *puVar1;
  size_t max_block_size_local;
  size_t first_local;
  OverheadTest *this_local;
  
  absl::lts_20250127::
  flat_hash_map<void_*,_unsigned_long,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::flat_hash_map(&this->sizes_);
  if (max_block_size != 0) {
    upb_Arena_SetMaxBlockSize(max_block_size);
  }
  (this->alloc_).alloc.func = size_checking_allocfunc;
  (this->alloc_).delegate_alloc = &upb_alloc_global;
  (this->alloc_).sizes = &this->sizes_;
  puVar1 = upb_Arena_Init((void *)0x0,first,&(this->alloc_).alloc);
  this->arena_ = puVar1;
  this->arena_alloced_ = 0;
  this->arena_alloc_count_ = 0;
  return;
}

Assistant:

explicit OverheadTest(size_t first = 0, size_t max_block_size = 0) {
    if (max_block_size) {
      upb_Arena_SetMaxBlockSize(max_block_size);
    }
    alloc_.alloc.func = size_checking_allocfunc;
    alloc_.delegate_alloc = &upb_alloc_global;
    alloc_.sizes = &sizes_;
    arena_ = upb_Arena_Init(nullptr, first, &alloc_.alloc);
    arena_alloced_ = 0;
    arena_alloc_count_ = 0;
  }